

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O0

void vu_save(t_gobj *z,_binbuf *b)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  t_symbol *ptVar13;
  t_symbol *ptVar14;
  t_symbol *ptVar15;
  t_symbol *local_88;
  t_symbol *srl [3];
  t_symbol *local_68;
  t_symbol *bflcol [3];
  t_vu *x;
  _binbuf *b_local;
  t_gobj *z_local;
  
  iemgui_save((t_iemgui *)z,&local_88,&local_68);
  ptVar13 = gensym("#X");
  ptVar14 = gensym("obj");
  sVar1 = *(short *)&z[2].g_next;
  sVar2 = *(short *)((long)&z[2].g_next + 2);
  ptVar15 = gensym("vu");
  iVar3 = *(int *)((long)&z[4].g_pd + 4);
  iVar4 = *(int *)((long)&z[3].g_pd[1].c_floatmethod + 4);
  iVar5 = *(int *)&z[4].g_pd;
  iVar6 = *(int *)((long)&z[3].g_pd[1].c_floatmethod + 4);
  uVar7 = *(undefined4 *)&z[5].g_pd;
  uVar8 = *(undefined4 *)((long)&z[5].g_pd + 4);
  iVar11 = iem_fstyletoint((t_iem_fstyle_flags *)(z + 0x44));
  uVar9 = *(undefined4 *)((long)&z[0x44].g_pd + 4);
  uVar10 = *(undefined4 *)((long)&z[0x4a].g_pd + 4);
  iVar12 = iem_symargstoint((t_iem_init_symargs *)&z[0x44].g_next);
  binbuf_addv(b,"ssiisiissiiiissii",ptVar13,ptVar14,(ulong)(uint)(int)sVar1,(ulong)(uint)(int)sVar2,
              ptVar15,iVar3 / iVar4,iVar5 / iVar6,srl[0],srl[1],uVar7,uVar8,iVar11,uVar9,local_68,
              bflcol[1],uVar10,iVar12);
  binbuf_addv(b,";");
  return;
}

Assistant:

static void vu_save(t_gobj *z, t_binbuf *b)
{
    t_vu *x = (t_vu *)z;
    t_symbol *bflcol[3];
    t_symbol *srl[3];

    iemgui_save(&x->x_gui, srl, bflcol);
    binbuf_addv(b, "ssiisiissiiiissii", gensym("#X"), gensym("obj"),
                (int)x->x_gui.x_obj.te_xpix, (int)x->x_gui.x_obj.te_ypix,
                gensym("vu"), x->x_gui.x_w/IEMGUI_ZOOM(x), x->x_gui.x_h/IEMGUI_ZOOM(x),
                srl[1], srl[2],
                x->x_gui.x_ldx, x->x_gui.x_ldy,
                iem_fstyletoint(&x->x_gui.x_fsf), x->x_gui.x_fontsize,
                bflcol[0], bflcol[2], x->x_scale,
                iem_symargstoint(&x->x_gui.x_isa));
    binbuf_addv(b, ";");
}